

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerMain.cpp
# Opt level: O1

void __thiscall
Analysis::LexicalAnalysis::LexicalAnalysis(LexicalAnalysis *this,string_view filename)

{
  std::ifstream::ifstream(this);
  (this->Types).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Types).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Tokens).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Types).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Tokens).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Tokens).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::open((char *)this,(_Ios_Openmode)filename._M_str);
  return;
}

Assistant:

LexicalAnalysis::LexicalAnalysis(std::string_view filename) {
        file.open(filename.data());
    }